

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

Error llvm::createStringError(error_code EC,Twine *S)

{
  Twine *in_RCX;
  error_code EC_00;
  string local_48;
  
  Twine::str_abi_cxx11_(&local_48,in_RCX);
  EC_00._M_cat._4_4_ = 0;
  EC_00._0_12_ = EC._0_12_;
  createStringError(EC_00,(char *)S);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (Error)EC._0_8_;
}

Assistant:

inline Error createStringError(std::error_code EC, const Twine &S) {
  return createStringError(EC, S.str().c_str());
}